

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_put_test.cc
# Opt level: O0

void __thiscall IntegrationTest_TestIoPut_Test::TestBody(IntegrationTest_TestIoPut_Test *this)

{
  uint uVar1;
  char *pcVar2;
  char *url;
  char local_1e8 [8];
  char key [100];
  char *dnRequest;
  char *dnBaseUrl;
  char *uptoken;
  undefined1 auStack_158 [4];
  Qiniu_RS_GetPolicy getPolicy;
  Qiniu_RS_PutPolicy putPolicy;
  Qiniu_Client client;
  IntegrationTest_TestIoPut_Test *this_local;
  
  uVar1 = rand();
  snprintf(local_1e8,100,"key_%d",(ulong)uVar1);
  Qiniu_Client_InitMacAuth((Qiniu_Client *)&putPolicy.fileType,0x400,(Qiniu_Mac *)0x0);
  Qiniu_Client_SetTimeout((Qiniu_Client *)&putPolicy.fileType,5000);
  Qiniu_Client_SetConnectTimeout((Qiniu_Client *)&putPolicy.fileType,3000);
  Qiniu_Client_EnableAutoQuery((Qiniu_Client *)&putPolicy.fileType,1);
  memset(auStack_158,0,0xa8);
  _auStack_158 = Test_bucket;
  pcVar2 = Qiniu_RS_PutPolicy_Token((Qiniu_RS_PutPolicy *)auStack_158,(Qiniu_Mac *)0x0);
  Qiniu_RS_Delete((Qiniu_Client *)&putPolicy.fileType,Test_bucket,local_1e8);
  clientIoPutFile(pcVar2,local_1e8);
  Qiniu_RS_Delete((Qiniu_Client *)&putPolicy.fileType,Test_bucket,local_1e8);
  clientIoPutBuffer(pcVar2,local_1e8);
  Qiniu_Free(pcVar2);
  memset((void *)((long)&uptoken + 4),0,4);
  pcVar2 = Qiniu_RS_MakeBaseUrl(Test_Domain,local_1e8);
  url = Qiniu_RS_GetPolicy_MakeRequest
                  ((Qiniu_RS_GetPolicy *)((long)&uptoken + 4),pcVar2,(Qiniu_Mac *)0x0);
  clientIoGet(url);
  Qiniu_Free(url);
  Qiniu_Free(pcVar2);
  Qiniu_Client_Cleanup((Qiniu_Client *)&putPolicy.fileType);
  return;
}

Assistant:

TEST(IntegrationTest, TestIoPut)
{
	Qiniu_Client client;
	Qiniu_RS_PutPolicy putPolicy;
	Qiniu_RS_GetPolicy getPolicy;
	char *uptoken;
	char *dnBaseUrl;
	char *dnRequest;
	char key[100];
	Qiniu_snprintf(key, 100, "key_%d", rand());

	Qiniu_Client_InitMacAuth(&client, 1024, NULL);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	Qiniu_Zero(putPolicy);
	putPolicy.scope = Test_bucket;
	uptoken = Qiniu_RS_PutPolicy_Token(&putPolicy, NULL);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutFile(uptoken, key);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutBuffer(uptoken, key);

	Qiniu_Free(uptoken);

	Qiniu_Zero(getPolicy);
	dnBaseUrl = Qiniu_RS_MakeBaseUrl(Test_Domain, key);
	dnRequest = Qiniu_RS_GetPolicy_MakeRequest(&getPolicy, dnBaseUrl, NULL);

	clientIoGet(dnRequest);

	Qiniu_Free(dnRequest);
	Qiniu_Free(dnBaseUrl);

	Qiniu_Client_Cleanup(&client);
}